

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O1

LY_ERR lys_compile_node_container(lysc_ctx *ctx,lysp_node *pnode,lysc_node *node)

{
  lys_module *plVar1;
  ulong uVar2;
  bool bVar3;
  LY_ERR LVar4;
  LY_ERR LVar5;
  long *plVar6;
  lysp_ext_instance *plVar7;
  int iVar8;
  long lVar9;
  lysp_restr *must_p;
  lysp_ext_instance *plVar10;
  lysp_node *plVar11;
  
  if (pnode[1].next != (lysp_node *)0x0) {
    *(byte *)&node->flags = (byte)node->flags | 0x80;
  }
  for (plVar11 = (lysp_node *)pnode[1].ref; plVar11 != (lysp_node *)0x0; plVar11 = plVar11->next) {
    LVar5 = lys_compile_node(ctx,plVar11,node,0,(ly_set *)0x0);
    if (LVar5 != LY_SUCCESS) {
      return LVar5;
    }
  }
  plVar11 = pnode[1].parent;
  if (plVar11 != (lysp_node *)0x0) {
    plVar1 = node[1].module;
    if (plVar1 == (lys_module *)0x0) {
      lVar9 = 0;
      plVar6 = (long *)calloc(1,(long)plVar11[-1].exts * 0x38 + 8);
    }
    else {
      lVar9 = *(long *)&plVar1[-1].implemented;
      plVar6 = (long *)realloc(&plVar1[-1].implemented,
                               ((long)&(plVar11[-1].exts)->name +
                               *(long *)&plVar1[-1].implemented + lVar9) * 0x38 + 8);
    }
    if (plVar6 == (long *)0x0) {
      bVar3 = false;
      LVar5 = LY_EMEM;
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).");
      iVar8 = 5;
    }
    else {
      node[1].module = (lys_module *)(plVar6 + 1);
      LVar5 = LY_SUCCESS;
      if (pnode[1].parent == (lysp_node *)0x0) {
        plVar10 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar10 = pnode[1].parent[-1].exts;
      }
      memset(plVar6 + *plVar6 * 7 + 1,0,((long)&plVar10->name + lVar9) * 0x38);
      bVar3 = true;
      iVar8 = 0;
    }
    if (bVar3) {
      plVar10 = (lysp_ext_instance *)0xffffffffffffffff;
      lVar9 = 0;
      LVar4 = LVar5;
      do {
        LVar5 = LVar4;
        plVar11 = pnode[1].parent;
        if (plVar11 == (lysp_node *)0x0) {
          plVar7 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar7 = plVar11[-1].exts;
        }
        plVar10 = (lysp_ext_instance *)((long)&plVar10->name + 1);
        if (plVar7 <= plVar10) {
          iVar8 = 0;
          goto LAB_0014bb5f;
        }
        plVar1 = node[1].module;
        uVar2 = *(ulong *)&plVar1[-1].implemented;
        must_p = (lysp_restr *)((long)&plVar11->parent + lVar9);
        lVar9 = lVar9 + 0x40;
        *(ulong *)&plVar1[-1].implemented = uVar2 + 1;
        LVar5 = lys_compile_must(ctx,must_p,
                                 (lysc_must *)
                                 (&plVar1->ctx + (-(ulong)(plVar1 == (lys_module *)0x0) | uVar2) * 7
                                 ));
        LVar4 = LY_SUCCESS;
      } while (LVar5 == LY_SUCCESS);
      iVar8 = 5;
    }
LAB_0014bb5f:
    if (iVar8 != 0) {
      return LVar5;
    }
  }
  LVar5 = lysc_unres_must_add(ctx,node,pnode);
  if ((LVar5 == LY_SUCCESS) && (LVar5 = lys_compile_node_augments(ctx,node), LVar5 == LY_SUCCESS)) {
    for (plVar11 = (lysp_node *)pnode[1].iffeatures; plVar11 != (lysp_node *)0x0;
        plVar11 = plVar11->next) {
      LVar5 = lys_compile_node(ctx,plVar11,node,0,(ly_set *)0x0);
      if (LVar5 != LY_SUCCESS) {
        return LVar5;
      }
    }
    plVar10 = pnode[1].exts;
    if (plVar10 == (lysp_ext_instance *)0x0) {
      LVar5 = LY_SUCCESS;
    }
    else {
      do {
        LVar5 = lys_compile_node(ctx,(lysp_node *)plVar10,node,0,(ly_set *)0x0);
        if (LVar5 != LY_SUCCESS) {
          return LVar5;
        }
        plVar10 = *(lysp_ext_instance **)&plVar10->format;
        LVar5 = LY_SUCCESS;
      } while (plVar10 != (lysp_ext_instance *)0x0);
    }
  }
  return LVar5;
}

Assistant:

static LY_ERR
lys_compile_node_container(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysc_node *node)
{
    struct lysp_node_container *cont_p = (struct lysp_node_container *)pnode;
    struct lysc_node_container *cont = (struct lysc_node_container *)node;
    struct lysp_node *child_p;
    LY_ERR ret = LY_SUCCESS;

    if (cont_p->presence) {
        /* presence container */
        cont->flags |= LYS_PRESENCE;
    }

    /* more cases when the container has meaning but is kept NP for convenience:
     *   - when condition
     *   - direct child action/notification
     */

    LY_LIST_FOR(cont_p->child, child_p) {
        ret = lys_compile_node(ctx, child_p, node, 0, NULL);
        LY_CHECK_GOTO(ret, done);
    }

    COMPILE_ARRAY_GOTO(ctx, cont_p->musts, cont->musts, lys_compile_must, ret, done);

    /* add must(s) to unres */
    ret = lysc_unres_must_add(ctx, node, pnode);
    LY_CHECK_GOTO(ret, done);

    /* connect any augments */
    LY_CHECK_GOTO(ret = lys_compile_node_augments(ctx, node), done);

    LY_LIST_FOR((struct lysp_node *)cont_p->actions, child_p) {
        ret = lys_compile_node(ctx, child_p, node, 0, NULL);
        LY_CHECK_GOTO(ret, done);
    }
    LY_LIST_FOR((struct lysp_node *)cont_p->notifs, child_p) {
        ret = lys_compile_node(ctx, child_p, node, 0, NULL);
        LY_CHECK_GOTO(ret, done);
    }

done:
    return ret;
}